

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O3

void __thiscall
r_exec::TimingGuardBuilder::write_guard
          (TimingGuardBuilder *this,Code *mdl,uint16_t l,uint16_t r,uint16_t opcode,uint64_t offset,
          uint16_t *write_index,uint16_t *extent_index)

{
  uint16_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Atom local_3c [4];
  uint64_t local_38;
  
  *extent_index = *extent_index + 1;
  local_38 = offset;
  r_code::Atom::AssignmentPointer((uchar)local_3c,l & 0xff);
  uVar1 = *write_index;
  *write_index = uVar1 + 1;
  iVar2 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::Operator((ushort)local_3c,(uchar)opcode);
  iVar2 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar2),local_3c);
  r_code::Atom::~Atom(local_3c);
  r_code::Atom::VLPointer((ushort)local_3c,r);
  uVar1 = *extent_index;
  *extent_index = uVar1 + 1;
  iVar2 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar2),local_3c);
  r_code::Atom::~Atom(local_3c);
  *extent_index = *extent_index + 1;
  r_code::Atom::IPointer((ushort)local_3c);
  iVar2 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar2),local_3c);
  r_code::Atom::~Atom(local_3c);
  uVar1 = *extent_index;
  *extent_index = uVar1 + 1;
  r_code::Utils::SetTimestamp(mdl,uVar1 + 1,local_38);
  *extent_index = *extent_index + 2;
  return;
}

Assistant:

void TimingGuardBuilder::write_guard(Code *mdl, uint16_t l, uint16_t r, uint16_t opcode, uint64_t offset, uint16_t &write_index, uint16_t &extent_index) const
{
    mdl->code(++write_index) = Atom::AssignmentPointer(l, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(opcode, 2); // l:(opcode r offset)
    mdl->code(++extent_index) = Atom::VLPointer(r);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 1);
    Utils::SetTimestamp(mdl, ++extent_index, offset);
    extent_index += 2;
}